

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMatterMeshless::VariablesFbLoadForces(ChMatterMeshless *this,double factor)

{
  ChMatrix33<double> *dst;
  ChMatrix33<double> *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  ChSystem *pCVar5;
  pointer psVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  Index size;
  ChProximityContainerMeshless *this_02;
  ChMatrix33<double> **ppCVar16;
  pointer psVar17;
  Index outer;
  long lVar18;
  Index index;
  ulong uVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  ChMatterMeshless *pCVar21;
  uint uVar22;
  Index index_1;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ActualDstType actualDst;
  pointer psVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ChMatrix33<double> mtensor;
  ChMatrix33<double> M_tmp;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  type tmp;
  ChStrainTensor<double> strainplasticflow;
  ChStrainTensor<double> proj_e_strain;
  assign_op<double,_double> local_291;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  ChMatterMeshless *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  ChProximityContainerMeshless *local_278;
  ChMatrix33<double> local_270;
  ChMatrix33<double> local_228;
  double local_1d8;
  ChMatrix33<double> *local_1c8;
  plainobjectbase_evaluator_data<double,_3> local_1c0;
  SrcEvaluatorType local_1b8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_148;
  DstXprType local_128;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  ChStrainTensor<double> local_a8;
  undefined1 local_78 [64];
  
  pCVar5 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
  psVar27 = (pCVar5->assembly).otherphysicslist.
            super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (pCVar5->assembly).otherphysicslist.
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_288 = this;
  local_1d8 = factor;
  if (psVar27 == psVar6) {
    p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_02 = (ChProximityContainerMeshless *)0x0;
  }
  else {
    this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      peVar7 = (psVar27->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_01 = (psVar27->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      if (peVar7 == (element_type *)0x0) {
        this_02 = (ChProximityContainerMeshless *)0x0;
      }
      else {
        this_02 = (ChProximityContainerMeshless *)
                  __dynamic_cast(peVar7,&ChPhysicsItem::typeinfo,
                                 &ChProximityContainerMeshless::typeinfo,0);
      }
      p_Var20 = this_01;
      if (this_02 == (ChProximityContainerMeshless *)0x0) {
        p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (this_02 != (ChProximityContainerMeshless *)0x0 &&
          this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
          p_Var20 = this_01;
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
          p_Var20 = this_01;
        }
      }
      if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    } while ((this_02 == (ChProximityContainerMeshless *)0x0) &&
            (psVar27 = psVar27 + 1, this_03 = p_Var20, psVar27 != psVar6));
  }
  pCVar21 = local_288;
  dVar1 = DAT_00b90ac8;
  dVar30 = DAT_00b90ac0;
  uVar15 = VNULL;
  local_278 = this_02;
  if (this_02 != (ChProximityContainerMeshless *)0x0) {
    psVar17 = (local_288->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar18 = (long)(local_288->nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar17;
    if (lVar18 != 0) {
      uVar22 = 1;
      uVar24 = 0;
      do {
        peVar8 = psVar17[uVar24].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        *(undefined8 *)&(peVar8->t_strain).super_ChVoightTensor<double> = 0;
        (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        *(undefined8 *)&(peVar8->e_stress).super_ChVoightTensor<double> = 0;
        (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        *(undefined8 *)&(peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3> = 0;
        (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0
        ;
        (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0
        ;
        (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0
        ;
        (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0
        ;
        (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0
        ;
        (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0
        ;
        (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0
        ;
        (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0
        ;
        *(undefined8 *)&(peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3> = 0;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0
        ;
        (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0
        ;
        if (peVar8 != (element_type *)(sBulletDNAstr64 + 0x3588)) {
          (peVar8->UserForce).m_data[0] = (double)uVar15;
          (peVar8->UserForce).m_data[1] = dVar30;
          (peVar8->UserForce).m_data[2] = dVar1;
        }
        peVar8->density = 0.0;
        uVar24 = (ulong)uVar22;
        uVar22 = uVar22 + 1;
      } while (uVar24 < (ulong)(lVar18 >> 4));
    }
    local_280 = p_Var20;
    ChProximityContainerMeshless::AccumulateStep1(this_02);
    psVar17 = (pCVar21->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pCVar21->nodes).
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar17) {
      uVar24 = 0;
      do {
        local_78._0_8_ = uVar24;
        peVar8 = psVar17[uVar24].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var20 = psVar17[uVar24].
                  super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
          }
        }
        if (peVar8 == (element_type *)0x0) {
          __assert_fail("mnode",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                        ,0x1ef,
                        "virtual void chrono::fea::ChMatterMeshless::VariablesFbLoadForces(double)")
          ;
        }
        dVar30 = 0.0;
        if (0.0 < peVar8->density) {
          dVar30 = (double)(**(code **)((long)(peVar8->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))
                                     (peVar8);
          dVar30 = dVar30 / peVar8->density;
        }
        peVar8->volume = dVar30;
        dst = &peVar8->Amoment;
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
             (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
             (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
             (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
             (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
             (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
             (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
             (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
             (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
             (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
        auVar31._8_8_ = 0;
        auVar31._0_8_ =
             local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
        auVar28._8_8_ = 0;
        auVar28._0_8_ =
             local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
        auVar34._8_8_ = 0;
        auVar34._0_8_ =
             local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
        auVar36._8_8_ = 0;
        auVar36._0_8_ =
             local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        auVar37._8_8_ = 0;
        auVar37._0_8_ =
             local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
             * local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
        auVar28 = vfmsub231sd_fma(auVar37,auVar28,auVar34);
        auVar35._8_8_ = 0;
        auVar35._0_8_ =
             local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
             * local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
        auVar34 = vfmsub231sd_fma(auVar35,auVar31,auVar34);
        auVar33._8_8_ = 0;
        auVar33._0_8_ =
             local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
             * local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
        auVar31 = vfmsub231sd_fma(auVar33,auVar31,auVar36);
        auVar11._8_8_ = 0x7fffffffffffffff;
        auVar11._0_8_ = 0x7fffffffffffffff;
        auVar32._8_8_ = 0;
        auVar32._0_8_ =
             auVar31._0_8_ *
             local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
             + (auVar28._0_8_ *
                local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [0] - auVar34._0_8_ *
                      local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[1]);
        auVar28 = vandpd_avx512vl(auVar32,auVar11);
        if (3e-05 <= auVar28._0_8_) {
          local_290 = p_Var20;
          local_1b8.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [0] = (double)&local_228;
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run(&dst->super_Matrix<double,_3,_3,_1,_3,_3>,(SrcXprType *)&local_1b8,
                (assign_op<double,_double> *)&local_128);
          this_00 = &peVar8->J;
          local_1c8 = dst;
          local_1b8.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [0] = (double)dst;
          local_1b8.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [1] = (double)this_00;
          ChMatrix33<double>::operator=
                    (&local_228,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                      *)&local_1b8);
          local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] + 1.0;
          local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
               local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] + 1.0;
          local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
               local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8] + 1.0;
          local_1b8.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [0] = (double)&local_228;
          ChMatrix33<double>::operator=
                    (this_00,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *
                             )&local_1b8);
          local_1b8.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [0] = (double)&local_228;
          local_1b8.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [1] = (double)this_00;
          ChMatrix33<double>::
          ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                    (&local_270,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                      *)&local_1b8);
          pCVar21 = local_288;
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] + -1.0;
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] + -1.0;
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8] + -1.0;
          (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
          (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
          (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
          (peVar8->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
          uStack_b8 = 0;
          uStack_b0 = 0;
          local_d8 = 0;
          uStack_d0 = 0;
          local_c8 = 0;
          uStack_c0 = 0;
          peVar9 = (local_288->material).
                   super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*(peVar9->super_ChContinuumElastic).super_ChContinuumMaterial._vptr_ChContinuumMaterial
            [6])(peVar9,&local_d8,
                 &((local_288->nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar24].
                   super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->t_strain);
          peVar10 = (pCVar21->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar24].
                    super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          auVar12._8_8_ = uStack_d0;
          auVar12._0_8_ = local_d8;
          auVar28 = vsubpd_avx(*(undefined1 (*) [16])
                                &(peVar10->e_strain).super_ChVoightTensor<double>,auVar12);
          local_a8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               auVar28._0_8_ + *(double *)&(peVar10->t_strain).super_ChVoightTensor<double>;
          local_a8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               auVar28._8_8_ +
               (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1];
          auVar13._8_8_ = uStack_c0;
          auVar13._0_8_ = local_c8;
          auVar28 = vsubpd_avx(*(undefined1 (*) [16])
                                ((peVar10->e_strain).super_ChVoightTensor<double>.
                                 super_ChVectorN<double,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array + 2),auVar13);
          local_a8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               auVar28._0_8_ +
               (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [2];
          local_a8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               auVar28._8_8_ +
               (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [3];
          auVar14._8_8_ = uStack_b0;
          auVar14._0_8_ = uStack_b8;
          auVar28 = vsubpd_avx(*(undefined1 (*) [16])
                                ((peVar10->e_strain).super_ChVoightTensor<double>.
                                 super_ChVectorN<double,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array + 4),auVar14);
          local_a8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
               auVar28._0_8_ +
               (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [4];
          local_a8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
               auVar28._8_8_ +
               (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [5];
          ChContinuumElastic::ComputeElasticStress
                    (&((pCVar21->material).
                       super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super_ChContinuumElastic,&peVar8->e_stress,&local_a8);
          p_Var20 = local_290;
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0];
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
               (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1];
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
               (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [2];
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
               (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [3];
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
               (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [4];
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
               (peVar8->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [5];
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
          local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
               local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
          dVar30 = peVar8->volume + peVar8->volume;
          ppCVar16 = (ChMatrix33<double> **)((long)&local_1b8 + 0x10);
          lVar18 = 0;
          do {
            dVar1 = local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[lVar18];
            dVar2 = local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[lVar18 + 3];
            dVar3 = local_270.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[lVar18 + 6];
            ppCVar16[-2] = (ChMatrix33<double> *)
                           (dVar30 * (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array[0] * dVar1 +
                           dVar30 * (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                    m_storage.m_data.array[1] * dVar2 +
                           dVar30 * (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                    m_storage.m_data.array[2] * dVar3);
            ppCVar16[-1] = (ChMatrix33<double> *)
                           (dVar1 * dVar30 * (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                             .m_storage.m_data.array[3] +
                           dVar2 * dVar30 * (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                            .m_storage.m_data.array[4] +
                           dVar3 * dVar30 * (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                            .m_storage.m_data.array[5]);
            *ppCVar16 = (ChMatrix33<double> *)
                        (dVar1 * dVar30 * (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                          .m_storage.m_data.array[6] +
                        dVar2 * dVar30 * (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data.array[7] +
                        dVar3 * dVar30 * (peVar8->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data.array[8]);
            lVar18 = lVar18 + 1;
            ppCVar16 = ppCVar16 + 3;
          } while (lVar18 != 3);
          local_1b8.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_rhs = &local_1c8->super_Matrix<double,_3,_3,_1,_3,_3>;
          local_1b8.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          .m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                      &local_1b8;
          local_1b8.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
          .m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
                      (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
                      local_1c8;
          local_1b8.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_innerDim = 3;
          local_1c0.data = (double *)&local_128;
          local_148.m_dst = (DstEvaluatorType *)&local_1c0;
          local_148.m_functor = &local_291;
          local_148.m_src =
               (SrcEvaluatorType *)
               local_1b8.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhsImpl.
               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.
               data;
          local_148.m_dstExpr = (DstXprType *)local_1c0.data;
          Eigen::internal::
          copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
          ::run(&local_148);
          (peVar8->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[0];
          (peVar8->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
               local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[1];
          (peVar8->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
               local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[2];
          (peVar8->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
               local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[3];
          (peVar8->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
               local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[4];
          (peVar8->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
               local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[5];
          (peVar8->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
               local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[6];
          (peVar8->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
               local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[7];
          (peVar8->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
               local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[8];
        }
        else {
          (dst->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               0.0;
          (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
               0.0;
          (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
               0.0;
          (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
               0.0;
          (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
               0.0;
          (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
               0.0;
          (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
               0.0;
          (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
               0.0;
          (peVar8->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
               0.0;
          (peVar8->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               0.0;
          (peVar8->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               0.0;
          (peVar8->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
               0.0;
          (peVar8->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
               0.0;
          (peVar8->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0
          ;
          (peVar8->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               0.0;
          (peVar8->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               0.0;
          (peVar8->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               0.0;
        }
        auVar29 = local_78;
        pCVar21 = local_288;
        if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
        }
        uVar24 = (ulong)(auVar29._0_4_ + 1);
        psVar17 = (pCVar21->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar24 < (ulong)((long)(pCVar21->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar17 >>
                               4));
    }
    ChProximityContainerMeshless::AccumulateStep2(local_278);
    psVar17 = (pCVar21->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pCVar21->nodes).
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar17) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_1d8;
      local_78 = vbroadcastsd_avx512f(auVar4);
      uVar24 = 0;
      do {
        pCVar5 = (pCVar21->super_ChIndexedNodes).super_ChPhysicsItem.system;
        dVar30 = (double)(**(code **)((long)((psVar17[uVar24].
                                              super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))
                                   ();
        psVar17 = (pCVar21->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar8 = psVar17[uVar24].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1b8.
        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [0] = dVar30 * (pCVar5->G_acc).m_data[0] + (peVar8->UserForce).m_data[0];
        local_1b8.
        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [1] = dVar30 * (pCVar5->G_acc).m_data[1] + (peVar8->UserForce).m_data[1];
        local_1b8.
        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [2] = dVar30 * (pCVar5->G_acc).m_data[2] + (peVar8->UserForce).m_data[2];
        p_Var20 = psVar17[uVar24].
                  super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
          }
        }
        if (peVar8 == (element_type *)0x0) {
          __assert_fail("mnode",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                        ,0x237,
                        "virtual void chrono::fea::ChMatterMeshless::VariablesFbLoadForces(double)")
          ;
        }
        ChVariables::Get_fb((ChVectorRef *)&local_128,&(peVar8->variables).super_ChVariables);
        if (local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[1] != 1.48219693752374e-323) {
          __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 3, 1>>, const Eigen::Map<Eigen::Matrix<double, 3, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                       );
        }
        uVar19 = 3;
        if ((((ulong)local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[0] & 7) == 0) &&
           (uVar19 = (ulong)(-((uint)((ulong)local_128.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                             .m_storage.m_data.array[0] >> 3) & 0x1fffffff) & 7),
           2 < uVar19)) {
          uVar19 = 3;
        }
        uVar25 = -uVar19 + 3;
        uVar23 = -uVar19 + 10;
        if (-1 < (long)uVar25) {
          uVar23 = uVar25;
        }
        if (uVar19 != 0) {
          uVar26 = 0;
          do {
            *(double *)
             ((long)local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                    .m_data.array[0] + uVar26 * 8) =
                 local_1d8 * (double)*(ChMatrix33<double> **)((long)&local_1b8 + uVar26 * 8) +
                 *(double *)
                  ((long)local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[0] + uVar26 * 8);
            uVar26 = uVar26 + 1;
          } while (uVar19 != uVar26);
        }
        lVar18 = (uVar23 & 0xfffffffffffffff8) + uVar19;
        if (7 < (long)uVar25) {
          do {
            auVar29 = vmulpd_avx512f(local_78,*(undefined1 (*) [64])((long)&local_1b8 + uVar19 * 8))
            ;
            auVar29 = vaddpd_avx512f(auVar29,*(undefined1 (*) [64])
                                              ((long)local_128.
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                  .m_storage.m_data.array[0] + uVar19 * 8));
            *(undefined1 (*) [64])
             ((long)local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                    .m_data.array[0] + uVar19 * 8) = auVar29;
            uVar19 = uVar19 + 8;
          } while ((long)uVar19 < lVar18);
        }
        if (lVar18 < 3) {
          do {
            *(double *)
             ((long)local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                    .m_data.array[0] + lVar18 * 8) =
                 local_1d8 * (double)*(ChMatrix33<double> **)((long)&local_1b8 + lVar18 * 8) +
                 *(double *)
                  ((long)local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[0] + lVar18 * 8);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
        }
        if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
        }
        uVar24 = (ulong)((int)uVar24 + 1);
        psVar17 = (pCVar21->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar24 < (ulong)((long)(pCVar21->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar17 >>
                               4));
    }
    if (local_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280);
    }
    return;
  }
  __assert_fail("edges",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                ,0x1da,"virtual void chrono::fea::ChMatterMeshless::VariablesFbLoadForces(double)");
}

Assistant:

void ChMatterMeshless::VariablesFbLoadForces(double factor) {
    // COMPUTE THE MESHLESS FORCES HERE

    // First, find if any ChProximityContainerMeshless object is present
    // in the system,

    std::shared_ptr<ChProximityContainerMeshless> edges;
    for (auto otherphysics : GetSystem()->Get_otherphysicslist()) {
        if ((edges = std::dynamic_pointer_cast<ChProximityContainerMeshless>(otherphysics)))
            break;
    }
    assert(edges);  // If using a ChMatterMeshless, you must add also a ChProximityContainerMeshless.

    // 1- Per-node initialization

    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->J.setZero();
        nodes[j]->Amoment.setZero();
        nodes[j]->t_strain.setZero();
        nodes[j]->e_stress.setZero();
        nodes[j]->UserForce = VNULL;
        nodes[j]->density = 0;
    }

    // 2- Per-edge initialization and accumulation of values in particles's J, Amoment, m_v, density

    edges->AccumulateStep1();

    // 3- Per-node inversion of A and computation of strain stress

    for (unsigned int j = 0; j < nodes.size(); j++) {
        std::shared_ptr<ChNodeMeshless> mnode(nodes[j]);
        assert(mnode);

        // node volume is v=mass/density
        if (mnode->density > 0)
            mnode->volume = mnode->GetMass() / mnode->density;
        else
            mnode->volume = 0;

        // Compute A inverse
        ChMatrix33<> M_tmp = mnode->Amoment;

        if (std::abs(M_tmp.determinant()) < 0.00003) {
            mnode->Amoment.setZero();     // deactivate if not possible to invert
            mnode->e_strain.setZero();  // detach
        } else {
            mnode->Amoment = M_tmp.inverse();

            // Compute J = ( A^-1 * [dwg | dwg | dwg] )' + I
            M_tmp = mnode->Amoment * mnode->J;
            M_tmp(0, 0) += 1;
            M_tmp(1, 1) += 1;
            M_tmp(2, 2) += 1;
            mnode->J = M_tmp.transpose();

            // Compute step strain tensor  de = J'*J - I
            ChMatrix33<> mtensor = M_tmp * mnode->J;
            mtensor(0, 0) -= 1;
            mtensor(1, 1) -= 1;
            mtensor(2, 2) -= 1;

            mnode->t_strain.ConvertFromMatrix(mtensor);  // store 'step strain' de, change in total strain

            ChStrainTensor<> strainplasticflow;
            material->ComputeReturnMapping(strainplasticflow,   // dEp, flow of elastic strain (correction)
                                           nodes[j]->t_strain,  // increment of total strain
                                           nodes[j]->e_strain,  // last elastic strain
                                           nodes[j]->p_strain   // last plastic strain
                                           );
            ChStrainTensor<> proj_e_strain = nodes[j]->e_strain - strainplasticflow + nodes[j]->t_strain;
            GetMaterial()->ComputeElasticStress(mnode->e_stress, proj_e_strain);
            mnode->e_stress.ConvertToMatrix(mtensor);

            /*
            // Compute elastic stress tensor  sigma= C*epsilon
            //   NOTE: it should be better to perform stress computation on corrected e_strain, _after_ the
            //   return mapping (see later), but for small timestep it could be the same.
            ChStrainTensor<> guesstot_e_strain; // anticipate the computation of total strain for anticipating strains
            guesstot_e_strain.MatrAdd(mnode->e_strain, mnode->t_strain);
            GetMaterial()->ComputeElasticStress(mnode->e_stress, guesstot_e_strain);
            mnode->e_stress.ConvertToMatrix(mtensor);
            */

            // Precompute 2*v*J*sigma*A^-1
            mnode->FA = (2 * mnode->volume) * mnode->J * mtensor * mnode->Amoment;
        }
    }

    // 4- Per-edge force transfer from stress, and add also viscous forces

    edges->AccumulateStep2();

    // 5- Per-node load force

    for (unsigned int j = 0; j < nodes.size(); j++) {
        // particle gyroscopic force:
        // none.

        // add gravity
        ChVector<> Gforce = GetSystem()->Get_G_acc() * nodes[j]->GetMass();
        ChVector<> TotForce = nodes[j]->UserForce + Gforce;

        std::shared_ptr<ChNodeMeshless> mnode(nodes[j]);
        assert(mnode);

        mnode->variables.Get_fb() += factor * TotForce.eigen();
    }
}